

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O3

bool __thiscall
Qentem::Value<char16_t>::
CopyValueTo<Qentem::StringStream<char16_t>,void(Qentem::StringStream<char16_t>&,char16_t_const*,unsigned_int)>
          (Value<char16_t> *this,StringStream<char16_t> *stream,RealFormatInfo format,
          _func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *string_function)

{
  SizeT new_capacity;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char16_t *from;
  char16_t *to;
  Value<char16_t> *number;
  Char_T storage [20];
  char16_t acStack_48 [20];
  
  for (; this->type_ == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  switch(this->type_) {
  case String:
    from = (this->field_0).string_.storage_;
    uVar2 = (this->field_0).array_.index_;
    if (string_function != (_func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *)0x0) {
      (*string_function)(stream,from,uVar2);
      return true;
    }
    uVar3 = stream->length_;
    uVar1 = uVar3 + uVar2;
    if (stream->capacity_ < uVar1) {
      StringStream<char16_t>::expand(stream,uVar1);
      uVar3 = stream->length_;
    }
    to = stream->storage_ + uVar3;
    goto LAB_00125b7f;
  case UIntLong:
    number = (this->field_0).array_.storage_;
    break;
  case IntLong:
    number = (this->field_0).array_.storage_;
    if ((long)number < 0) {
      uVar1 = stream->length_;
      new_capacity = uVar1 + 1;
      if (stream->capacity_ == uVar1) {
        StringStream<char16_t>::expand(stream,new_capacity);
        uVar1 = stream->length_;
      }
      number = (Value<char16_t> *)-(long)number;
      stream->storage_[uVar1] = L'-';
      stream->length_ = new_capacity;
    }
    break;
  case Double:
    Digit::realToString<double,Qentem::StringStream<char16_t>,unsigned_long_long>
              (stream,(unsigned_long_long)(this->field_0).array_.storage_,format);
    return true;
  case True:
    uVar2 = stream->length_;
    uVar1 = uVar2 + 4;
    if (stream->capacity_ < uVar1) {
      StringStream<char16_t>::expand(stream,uVar1);
      uVar2 = stream->length_;
    }
    to = stream->storage_ + uVar2;
    from = L"true";
    goto LAB_00125bd9;
  case False:
    uVar2 = stream->length_;
    uVar1 = uVar2 + 5;
    if (stream->capacity_ < uVar1) {
      StringStream<char16_t>::expand(stream,uVar1);
      uVar2 = stream->length_;
    }
    to = stream->storage_ + uVar2;
    from = L"false";
    uVar2 = 10;
    goto LAB_00125bde;
  case Null:
    uVar2 = stream->length_;
    uVar1 = uVar2 + 4;
    if (stream->capacity_ < uVar1) {
      StringStream<char16_t>::expand(stream,uVar1);
      uVar2 = stream->length_;
    }
    to = stream->storage_ + uVar2;
    from = L"null";
LAB_00125bd9:
    uVar2 = 8;
    goto LAB_00125bde;
  default:
    return false;
  }
  uVar2 = Digit::IntToString<false,char16_t,unsigned_long_long>
                    ((char16_t *)&stack0xffffffffffffffe0,(unsigned_long_long)number);
  uVar3 = stream->length_;
  uVar1 = uVar3 + uVar2;
  if (stream->capacity_ < uVar1) {
    StringStream<char16_t>::expand(stream,uVar1);
    uVar3 = stream->length_;
  }
  to = stream->storage_ + uVar3;
  from = acStack_48 + (0x14 - uVar2);
LAB_00125b7f:
  uVar2 = uVar2 * 2;
LAB_00125bde:
  Memory::Copy<unsigned_int>(to,from,uVar2);
  stream->length_ = uVar1;
  return true;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }